

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_concat(lua_State *L,int total)

{
  StkId top_00;
  bool bVar1;
  ulong local_a8;
  TString *local_98;
  TString *x_;
  TValue *io;
  char buff [40];
  size_t l;
  TString *ts;
  size_t tl;
  TValue *io2;
  TValue *io1;
  int n;
  StkId top;
  int total_local;
  lua_State *L_local;
  
  top._4_4_ = total;
  if (total != 1) {
    do {
      top_00 = (L->top).p;
      io1._4_4_ = 2;
      if (((undefined1  [16])((undefined1  [16])*top_00 & (undefined1  [16])0xf) ==
           (undefined1  [16])0x4) ||
         ((undefined1  [16])((undefined1  [16])*top_00 & (undefined1  [16])0xf) ==
          (undefined1  [16])0x3)) {
        if ((undefined1  [16])((undefined1  [16])*top_00 & (undefined1  [16])0xf) !=
            (undefined1  [16])0x4) {
          if ((undefined1  [16])((undefined1  [16])*top_00 & (undefined1  [16])0xf) !=
              (undefined1  [16])0x3) goto LAB_0012faf9;
          luaO_tostring(L,&top_00[-1].val);
        }
        if ((*(char *)((long)top_00 + -8) == 'D') &&
           (top_00[-1].val.value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
          if (((undefined1  [16])((undefined1  [16])*top_00 & (undefined1  [16])0xf) !=
               (undefined1  [16])0x4) &&
             ((undefined1  [16])((undefined1  [16])*top_00 & (undefined1  [16])0xf) ==
              (undefined1  [16])0x3)) {
            luaO_tostring(L,&top_00[-2].val);
          }
        }
        else if ((*(char *)((long)top_00 + -0x18) == 'D') &&
                (top_00[-2].val.value_.f[0xb] == (_func_int_lua_State_ptr)0x0)) {
          top_00[-2].val.value_ = top_00[-1].val.value_;
          *(undefined1 *)((long)top_00 + -0x18) = *(undefined1 *)((long)top_00 + -8);
        }
        else {
          if ((char)top_00[-1].val.value_.f[0xb] < '\0') {
            local_98 = *(TString **)(top_00[-1].val.value_.f + 0x10);
          }
          else {
            local_98 = (TString *)(long)(char)top_00[-1].val.value_.f[0xb];
          }
          ts = local_98;
          io1._4_4_ = 1;
          while( true ) {
            bVar1 = false;
            if (((io1._4_4_ < top._4_4_) &&
                (bVar1 = true, (*(byte *)((long)top_00 + (long)io1._4_4_ * -0x10 + -8) & 0xf) != 4))
               && (bVar1 = (*(byte *)((long)top_00 + (long)io1._4_4_ * -0x10 + -8) & 0xf) == 3,
                  bVar1)) {
              luaO_tostring(L,&top_00[-1 - (long)io1._4_4_].val);
            }
            if (!bVar1) break;
            if ((char)top_00[-1 - (long)io1._4_4_].val.value_.f[0xb] < '\0') {
              local_a8 = *(ulong *)(top_00[-1 - (long)io1._4_4_].val.value_.f + 0x10);
            }
            else {
              local_a8 = (ulong)(char)top_00[-1 - (long)io1._4_4_].val.value_.f[0xb];
            }
            buff[0x20] = (undefined1)local_a8;
            buff[0x21] = local_a8._1_1_;
            buff[0x22] = local_a8._2_1_;
            buff[0x23] = local_a8._3_1_;
            buff[0x24] = local_a8._4_1_;
            buff[0x25] = local_a8._5_1_;
            buff[0x26] = local_a8._6_1_;
            buff[0x27] = local_a8._7_1_;
            if (0x7fffffffffffffcfU - (long)ts <= local_a8) {
              (L->top).p = top_00 + -(long)top._4_4_;
              luaG_runerror(L,"string length overflow");
            }
            ts = (TString *)((long)&ts->next + local_a8);
            io1._4_4_ = io1._4_4_ + 1;
            buff._32_8_ = local_a8;
          }
          if (ts < (TString *)0x29) {
            copy2buff(top_00,io1._4_4_,(char *)&io);
            l = (size_t)luaS_newlstr(L,(char *)&io,(size_t)ts);
          }
          else {
            l = (size_t)luaS_createlngstrobj(L,(size_t)ts);
            copy2buff(top_00,io1._4_4_,((TString *)l)->contents);
          }
          top_00[-(long)io1._4_4_].val.value_.i = l;
          top_00[-(long)io1._4_4_].val.tt_ = *(byte *)(l + 8) | 0x40;
        }
      }
      else {
LAB_0012faf9:
        luaT_tryconcatTM(L);
      }
      top._4_4_ = top._4_4_ - (io1._4_4_ + -1);
      (L->top).p = (L->top).p + -(long)(io1._4_4_ + -1);
    } while (1 < top._4_4_);
  }
  return;
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  if (total == 1)
    return;  /* "all" values already concatenated */
  do {
    StkId top = L->top.p;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(s2v(top - 2)) || cvt2str(s2v(top - 2))) ||
        !tostring(L, s2v(top - 1)))
      luaT_tryconcatTM(L);  /* may invalidate 'top' */
    else if (isemptystr(s2v(top - 1)))  /* second operand is empty? */
      cast_void(tostring(L, s2v(top - 2)));  /* result is first operand */
    else if (isemptystr(s2v(top - 2))) {  /* first operand is empty string? */
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsslen(tsvalue(s2v(top - 1)));
      TString *ts;
      /* collect total length and number of strings */
      for (n = 1; n < total && tostring(L, s2v(top - n - 1)); n++) {
        size_t l = tsslen(tsvalue(s2v(top - n - 1)));
        if (l_unlikely(l >= MAX_SIZE - sizeof(TString) - tl)) {
          L->top.p = top - total;  /* pop strings to avoid wasting stack */
          luaG_runerror(L, "string length overflow");
        }
        tl += l;
      }
      if (tl <= LUAI_MAXSHORTLEN) {  /* is result a short string? */
        char buff[LUAI_MAXSHORTLEN];
        copy2buff(top, n, buff);  /* copy strings to buffer */
        ts = luaS_newlstr(L, buff, tl);
      }
      else {  /* long string; copy strings directly to final result */
        ts = luaS_createlngstrobj(L, tl);
        copy2buff(top, n, getlngstr(ts));
      }
      setsvalue2s(L, top - n, ts);  /* create result */
    }
    total -= n - 1;  /* got 'n' strings to create one new */
    L->top.p -= n - 1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}